

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::executePrimaryBufferTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkResult VVar1;
  int iVar2;
  VkDevice device;
  DeviceInterface *vk;
  VkQueue pVVar3;
  allocator<char> local_179;
  RefBase<vk::VkCommandBuffer_s_*> local_178;
  string local_158;
  RefBase<vk::Handle<(vk::HandleType)10>_> local_138;
  RefBase<vk::Handle<(vk::HandleType)6>_> local_118;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_f8;
  VkSubmitInfo submitInfo;
  VkCommandBufferBeginInfo primCmdBufBeginInfo;
  VkCommandPoolCreateInfo cmdPoolParams;
  VkCommandBufferAllocateInfo cmdBufParams;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  pVVar3 = Context::getUniversalQueue(context);
  cmdPoolParams.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  cmdPoolParams.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  cmdPoolParams.pNext = (void *)0x0;
  cmdPoolParams.flags = 2;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,vk,device,&cmdPoolParams,
             (VkAllocationCallbacks *)0x0);
  local_f8.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_f8.m_data.object.m_internal = submitInfo._0_8_;
  local_f8.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&submitInfo);
  cmdBufParams.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  cmdBufParams.pNext = (void *)0x0;
  cmdBufParams.commandPool.m_internal = local_f8.m_data.object.m_internal;
  cmdBufParams.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  cmdBufParams.commandBufferCount = 1;
  ::vk::allocateCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&submitInfo,vk,device,&cmdBufParams);
  local_178.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_178.m_data.deleter.m_pool.m_internal = (deUint64)submitInfo.pWaitSemaphores;
  local_178.m_data.object = (VkCommandBuffer_s *)submitInfo._0_8_;
  local_178.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&submitInfo);
  primCmdBufBeginInfo.flags = 0;
  primCmdBufBeginInfo._20_4_ = 0;
  primCmdBufBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  primCmdBufBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  primCmdBufBeginInfo._4_4_ = 0;
  primCmdBufBeginInfo.pNext = (void *)0x0;
  ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)&submitInfo,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_138.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_138.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_138.m_data.object.m_internal = submitInfo._0_8_;
  local_138.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)10>_> *)&submitInfo);
  VVar1 = (*vk->_vptr_DeviceInterface[0x1d])(vk,device,local_138.m_data.object.m_internal);
  ::vk::checkResult(VVar1,"vk.resetEvent(vkDevice, *event)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x36f);
  VVar1 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_178.m_data.object,&primCmdBufBeginInfo);
  ::vk::checkResult(VVar1,"vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x372);
  (*vk->_vptr_DeviceInterface[0x6a])
            (vk,local_178.m_data.object,local_138.m_data.object.m_internal,0x10000);
  VVar1 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_178.m_data.object);
  ::vk::checkResult(VVar1,"vk.endCommandBuffer(*primCmdBuf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x37a);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_118.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_118.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_118.m_data.object.m_internal = submitInfo._0_8_;
  local_118.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&submitInfo);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&local_178;
  VVar1 = (*vk->_vptr_DeviceInterface[2])
                    (vk,pVVar3,1,&submitInfo,local_118.m_data.object.m_internal);
  ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x38d);
  VVar1 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_118,0,0xffffffffffffffff);
  ::vk::checkResult(VVar1,"vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x390);
  iVar2 = (*vk->_vptr_DeviceInterface[0x1b])(vk,device,local_138.m_data.object.m_internal);
  if (iVar2 == 3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"Execute Primary Command Buffer succeeded",&local_179);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_158);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"Execute Primary Command Buffer FAILED",&local_179);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_158);
  }
  std::__cxx11::string::~string((string *)&local_158);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase(&local_118);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase(&local_138);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_178);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_f8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus executePrimaryBufferTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			//	VkCommandPoolCreateFlags	flags;
		queueFamilyIndex,											//	deUint32					queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		*cmdPool,													//	VkCommandPool				pool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							//	VkCommandBufferLevel		level;
		1u,															//	uint32_t					bufferCount;
	};
	const Unique<VkCommandBuffer>			primCmdBuf				(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));
	const VkCommandBufferBeginInfo			primCmdBufBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		0,															// flags
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	// create event that will be used to check if secondary command buffer has been executed
	const Unique<VkEvent>					event					(createEvent(vk, vkDevice));

	// reset event
	VK_CHECK(vk.resetEvent(vkDevice, *event));

	// record primary command buffer
	VK_CHECK(vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo));
	{
		// allow execution of event during every stage of pipeline
		VkPipelineStageFlags stageMask = VK_PIPELINE_STAGE_ALL_COMMANDS_BIT;

		// record setting event
		vk.cmdSetEvent(*primCmdBuf, *event,stageMask);
	}
	VK_CHECK(vk.endCommandBuffer(*primCmdBuf));

	// create fence to wait for execution of queue
	const Unique<VkFence>					fence					(createFence(vk, vkDevice));

	const VkSubmitInfo						submitInfo				=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,								// sType
		DE_NULL,													// pNext
		0u,															// waitSemaphoreCount
		DE_NULL,													// pWaitSemaphores
		(const VkPipelineStageFlags*)DE_NULL,						// pWaitDstStageMask
		1,															// commandBufferCount
		&primCmdBuf.get(),											// pCommandBuffers
		0u,															// signalSemaphoreCount
		DE_NULL,													// pSignalSemaphores
	};

	// Submit the command buffer to the queue
	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));

	// wait for end of execution of queue
	VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT));

	// check if buffer has been executed
	VkResult result = vk.getEventStatus(vkDevice,*event);
	if (result == VK_EVENT_SET)
		return tcu::TestStatus::pass("Execute Primary Command Buffer succeeded");

	return tcu::TestStatus::fail("Execute Primary Command Buffer FAILED");
}